

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall cmTarget::IsImportedGloballyVisible(cmTarget *this)

{
  pointer pcVar1;
  cmTarget *this_local;
  
  pcVar1 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  if (pcVar1->TargetVisibility < ImportedGlobally) {
    this_local._7_1_ = false;
  }
  else {
    if (pcVar1->TargetVisibility != ImportedGlobally) {
      __assert_fail("false && \"unknown visibility (IsImportedGloballyVisible)\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmTarget.cxx"
                    ,0xb6f,"bool cmTarget::IsImportedGloballyVisible() const");
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmTarget::IsImportedGloballyVisible() const
{
  switch (this->impl->TargetVisibility) {
    case Visibility::ImportedGlobally:
      return true;
    case Visibility::Normal:
    case Visibility::Generated:
    case Visibility::Imported:
      return false;
  }
  assert(false && "unknown visibility (IsImportedGloballyVisible)");
  return false;
}